

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::
vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::split_alternative_node_task_params>::
resize(vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::split_alternative_node_task_params>
       *this,uint new_size,bool grow_hint)

{
  byte local_21;
  bool grow_hint_local;
  uint new_size_local;
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::split_alternative_node_task_params>
  *this_local;
  
  if (this->m_size != new_size) {
    if (new_size < this->m_size) {
      scalar_type<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::split_alternative_node_task_params>
      ::destruct_array(this->m_p + new_size,this->m_size - new_size);
    }
    else {
      if (this->m_capacity < new_size) {
        local_21 = 1;
        if (new_size != this->m_size + 1) {
          local_21 = grow_hint;
        }
        increase_capacity(this,new_size,(bool)(local_21 & 1),false);
      }
      scalar_type<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::split_alternative_node_task_params>
      ::construct_array(this->m_p + this->m_size,new_size - this->m_size);
    }
    this->m_size = new_size;
  }
  return;
}

Assistant:

inline void resize(uint new_size, bool grow_hint = false)
        {
            if (m_size != new_size) {
                if (new_size < m_size)
                {
                    scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
                }
                else
                {
                    if (new_size > m_capacity)
                    {
                        increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint);
                    }

                    scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
                }

                m_size = new_size;
            }
        }